

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O1

class_<anurbs::Model,_std::shared_ptr<anurbs::Model>_> * __thiscall
pybind11::class_<anurbs::Model,std::shared_ptr<anurbs::Model>>::
def<pybind11::object(*)(anurbs::Model_const&,unsigned_long),pybind11::arg>
          (class_<anurbs::Model,std::shared_ptr<anurbs::Model>> *this,char *name_,
          _func_object_Model_ptr_unsigned_long **f,arg *extra)

{
  _func_object_Model_ptr_unsigned_long *f_00;
  cpp_function cf;
  handle local_68;
  cpp_function local_60;
  handle local_58;
  is_method local_50;
  object local_48;
  name local_40;
  handle local_38;
  handle local_30;
  object local_28;
  
  f_00 = *f;
  local_50.class_.m_ptr = *(handle *)this;
  local_48.super_handle.m_ptr = (handle)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  local_40.value = name_;
  local_68.m_ptr = (PyObject *)PyObject_GetAttrString();
  if (local_68.m_ptr == (PyObject *)0x0) {
    PyErr_Clear();
    local_68.m_ptr = (PyObject *)&_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
  }
  local_60.super_function.super_object.super_handle.m_ptr = (function)(function)local_68.m_ptr;
  cpp_function::
  cpp_function<pybind11::object,anurbs::Model_const&,unsigned_long,pybind11::name,pybind11::is_method,pybind11::sibling,pybind11::arg>
            ((cpp_function *)&local_58,f_00,&local_40,&local_50,(sibling *)&local_60,extra);
  object::~object((object *)&local_68);
  object::~object(&local_48);
  cpp_function::name(&local_60);
  local_38.m_ptr = *(PyObject **)this;
  if ((object)local_60.super_function.super_object.super_handle.m_ptr != (PyObject *)0x0) {
    *(long *)local_60.super_function.super_object.super_handle.m_ptr =
         *(long *)local_60.super_function.super_object.super_handle.m_ptr + 1;
  }
  local_30.m_ptr = (PyObject *)local_60.super_function.super_object.super_handle.m_ptr;
  local_50.class_.m_ptr = (handle)(PyObject *)0x0;
  local_28.super_handle.m_ptr = (handle)(PyObject *)0x0;
  object::~object((object *)&local_50);
  detail::accessor_policies::obj_attr::set(local_38,local_30,local_58);
  object::~object(&local_28);
  object::~object((object *)&local_30);
  object::~object((object *)&local_60);
  object::~object((object *)&local_58);
  return (class_<anurbs::Model,_std::shared_ptr<anurbs::Model>_> *)this;
}

Assistant:

class_ &def(const char *name_, Func&& f, const Extra&... extra) {
        cpp_function cf(method_adaptor<type>(std::forward<Func>(f)), name(name_), is_method(*this),
                        sibling(getattr(*this, name_, none())), extra...);
        attr(cf.name()) = cf;
        return *this;
    }